

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::concat<kj::CappedArray<char,26ul>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_26UL> *params)

{
  size_t size;
  char *target;
  CappedArray<char,_26UL> *first;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_38;
  _ *local_30;
  undefined8 local_28;
  undefined1 local_19;
  NoInfer<kj::CappedArray<char,_26UL>_> *local_18;
  CappedArray<char,_26UL> *params_local;
  String *result;
  
  local_19 = 0;
  local_18 = (NoInfer<kj::CappedArray<char,_26UL>_> *)this;
  params_local = (CappedArray<char,_26UL> *)__return_storage_ptr__;
  local_38 = CappedArray<char,_26UL>::size((CappedArray<char,_26UL> *)this);
  local_30 = (_ *)&local_38;
  local_28 = 1;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x1;
  size = sum(local_30,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::CappedArray<char,26ul>>(local_18);
  fill<kj::CappedArray<char,26ul>>(target,first);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}